

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_15e2a78::DirectoryObject::DumpInstallerPath
          (Value *__return_storage_ptr__,DirectoryObject *this,string *top,string *fromPathIn,
          string *toPath)

{
  char *__n1;
  int iVar1;
  long lVar2;
  Value *pVVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string fromPath;
  string local_68;
  ValueHolder local_48;
  pointer local_40;
  
  Json::Value::Value(__return_storage_ptr__,nullValue);
  cmSystemTools::RelativeIfUnder(&local_68,(string *)this,top);
  lVar2 = std::__cxx11::string::find((char)fromPathIn,0x2f);
  if (lVar2 == -1) {
    __n1 = (char *)fromPathIn->_M_string_length;
    local_48.string_ = (char *)local_68._M_string_length;
    local_40 = local_68._M_dataplus._M_p;
    if (__n1 <= local_68._M_string_length) {
      __str._M_str = (fromPathIn->_M_dataplus)._M_p;
      __str._M_len = (size_t)__n1;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_48,
                         local_68._M_string_length - (long)__n1,(size_type)__n1,__str);
      if (iVar1 == 0) {
        if (((char *)local_68._M_string_length == (char *)fromPathIn->_M_string_length) ||
           (((char *)(local_68._M_string_length + (long)local_68._M_dataplus._M_p))
            [~(ulong)fromPathIn->_M_string_length] == '/')) {
          Json::Value::Value((Value *)&local_48,&local_68);
          pVVar3 = __return_storage_ptr__;
          goto LAB_003c81d8;
        }
      }
    }
  }
  Json::Value::Value((Value *)&local_48,objectValue);
  Json::Value::operator=(__return_storage_ptr__,(Value *)&local_48);
  Json::Value::~Value((Value *)&local_48);
  Json::Value::Value((Value *)&local_48,&local_68);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"from");
  Json::Value::operator=(pVVar3,(Value *)&local_48);
  Json::Value::~Value((Value *)&local_48);
  Json::Value::Value((Value *)&local_48,fromPathIn);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"to");
LAB_003c81d8:
  Json::Value::operator=(pVVar3,(Value *)&local_48);
  Json::Value::~Value((Value *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value DirectoryObject::DumpInstallerPath(std::string const& top,
                                               std::string const& fromPathIn,
                                               std::string const& toPath)
{
  Json::Value installPath;

  std::string fromPath = RelativeIfUnder(top, fromPathIn);

  // If toPath is the last component of fromPath, use just fromPath.
  if (toPath.find_first_of('/') == std::string::npos &&
      cmHasSuffix(fromPath, toPath) &&
      (fromPath.size() == toPath.size() ||
       fromPath[fromPath.size() - toPath.size() - 1] == '/')) {
    installPath = fromPath;
  } else {
    installPath = Json::objectValue;
    installPath["from"] = fromPath;
    installPath["to"] = toPath;
  }

  return installPath;
}